

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::save_load(gd *g,io_buf *model_file,bool read,bool text)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  ostream *len;
  void *this;
  byte in_CL;
  uint uVar5;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  stringstream msg;
  gd *in_stack_000000b8;
  bool in_stack_000000c6;
  bool in_stack_000000c7;
  io_buf *in_stack_000000c8;
  vw *in_stack_000000d0;
  bool resume;
  pair<float,_float> p;
  float init_weight;
  vw *all;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  vw *in_stack_fffffffffffffe00;
  pair<float,_float> *in_stack_fffffffffffffe08;
  undefined1 text_00;
  vw *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  io_buf *in_stack_fffffffffffffe38;
  pair<float,_float> *in_stack_fffffffffffffe48;
  dense_parameters *in_stack_fffffffffffffe50;
  vw *in_stack_fffffffffffffe80;
  
  lVar1 = *(long *)(in_RDI + 0x60);
  if ((in_DL & 1) != 0) {
    initialize_regressor((vw *)0x19c82d);
    if (((*(byte *)(lVar1 + 0x343c) & 1) != 0) && (0.0 < *(float *)(lVar1 + 0x355c))) {
      std::make_pair<float&,float&>
                ((float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (float *)0x19c893);
      if ((*(byte *)(lVar1 + 0x3590) & 1) == 0) {
        dense_parameters::
        set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<dense_parameters>>
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      else {
        sparse_parameters::
        set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<sparse_parameters>>
                  ((sparse_parameters *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      }
    }
    if ((*(float *)(in_RDI + 0x18) != 0.0) || (NAN(*(float *)(in_RDI + 0x18)))) {
      VW::set_weight(in_stack_fffffffffffffe10,(uint32_t)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffe08,
                     (float)((ulong)in_stack_fffffffffffffe00 >> 0x20));
    }
  }
  text_00 = (undefined1)((ulong)in_stack_fffffffffffffe08 >> 0x38);
  sVar3 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar3 != 0) {
    bVar2 = (bool)(*(byte *)(lVar1 + 0x9e) & 1);
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe48);
    poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffe58,":");
    len = (ostream *)std::ostream::operator<<(poVar4,bVar2);
    std::operator<<(len,"\n");
    uVar5 = (uint)(in_CL & 1);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe38,(char *)poVar4,(size_t)len,
               (char *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0),
               (stringstream *)in_stack_fffffffffffffe10,(bool)text_00);
    if (bVar2 == false) {
      save_load_regressor(in_stack_fffffffffffffe00,
                          (io_buf *)CONCAT44(in_stack_fffffffffffffdfc,uVar5),false,false);
    }
    else {
      if (((in_DL & 1) != 0) &&
         (bVar2 = version_struct::operator<
                            ((version_struct *)
                             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe18), bVar2)) {
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((void *)(lVar1 + 0xe0),std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,
                                 "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
                                );
        poVar4 = std::operator<<(poVar4,"7.10.1");
        this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      save_load_online_state
                (in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c6,
                 in_stack_000000b8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe48);
  }
  if ((*(byte *)(lVar1 + 0x343a) & 1) == 0) {
    sync_weights(in_stack_fffffffffffffe80);
  }
  return;
}

Assistant:

void save_load(gd& g, io_buf& model_file, bool read, bool text)
{
  vw& all = *g.all;
  if (read)
  {
    initialize_regressor(all);

    if (all.adaptive && all.initial_t > 0)
    {
      float init_weight = all.initial_weight;
      pair<float, float> p = make_pair(init_weight, all.initial_t);
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<pair<float, float>, set_initial_gd_wrapper<sparse_parameters> >(p);
      else
        all.weights.dense_weights.set_default<pair<float, float>, set_initial_gd_wrapper<dense_parameters> >(p);
      // for adaptive update, we interpret initial_t as previously seeing initial_t fake datapoints, all with squared
      // gradient=1 NOTE: this is not invariant to the scaling of the data (i.e. when combined with normalized). Since
      // scaling the data scales the gradient, this should ideally be feature_range*initial_t, or something like that.
      // We could potentially fix this by just adding this base quantity times the current range to the sum of gradients
      // stored in memory at each update, and always start sum of gradients to 0, at the price of additional additions
      // and multiplications during the update...
    }
    if (g.initial_constant != 0.0)
      VW::set_weight(all, constant, 0, g.initial_constant);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);
    if (resume)
    {
      if (read && all.model_file_ver < VERSION_SAVE_RESUME_FIX)
        all.trace_message
            << endl
            << "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
            << VERSION_SAVE_RESUME_FIX << endl
            << endl;
      // save_load_online_state(g, model_file, read, text);
      save_load_online_state(all, model_file, read, text, &g);
    }
    else
      save_load_regressor(all, model_file, read, text);
  }
  if (!all.training)  // If the regressor was saved as --save_resume, then when testing we want to materialize the
                      // weights.
    sync_weights(all);
}